

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

istream * Json::operator>>(istream *sin,Value *root)

{
  bool bVar1;
  string errs;
  CharReaderBuilder b;
  string local_90;
  string local_70;
  CharReaderBuilder local_50;
  
  CharReaderBuilder::CharReaderBuilder(&local_50);
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  bVar1 = parseFromStream(&local_50.super_Factory,sin,root,&local_70);
  if (!bVar1) {
    fprintf(_stderr,"Error from reader: %s",local_70._M_dataplus._M_p);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"reader error","");
    throwRuntimeError(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_50.super_Factory._vptr_Factory = (_func_int **)&PTR__CharReaderBuilder_0012eaa8;
  Value::~Value(&local_50.settings_);
  return sin;
}

Assistant:

std::istream& operator>>(std::istream& sin, Value& root) {
  CharReaderBuilder b;
  std::string errs;
  bool ok = parseFromStream(b, sin, &root, &errs);
  if (!ok) {
    fprintf(stderr,
            "Error from reader: %s",
            errs.c_str());

    throwRuntimeError("reader error");
  }
  return sin;
}